

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_sha256.cpp
# Opt level: O0

void __thiscall CHMAC_SHA256::CHMAC_SHA256(CHMAC_SHA256 *this,uchar *key,size_t keylen)

{
  uchar *in_RDX;
  CSHA256 *in_RSI;
  CSHA256 *in_RDI;
  long in_FS_OFFSET;
  int n_1;
  int n;
  uchar rkey [64];
  int local_d0;
  int local_cc;
  CSHA256 *len;
  uchar *in_stack_ffffffffffffff50;
  CSHA256 *in_stack_ffffffffffffff58;
  byte local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  len = in_RDI;
  CSHA256::CSHA256(in_RDI);
  CSHA256::CSHA256(in_RDI);
  if (in_RDX < (uchar *)0x41) {
    memcpy(local_48,in_RSI,(size_t)in_RDX);
    memset(local_48 + (long)in_RDX,0,0x40 - (long)in_RDX);
  }
  else {
    CSHA256::CSHA256(in_RDI);
    CSHA256::Write(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,(size_t)len);
    CSHA256::Finalize(in_RSI,in_RDX);
    memset(local_48 + 0x20,0,0x20);
  }
  for (local_cc = 0; local_cc < 0x40; local_cc = local_cc + 1) {
    local_48[local_cc] = local_48[local_cc] ^ 0x5c;
  }
  CSHA256::Write(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,(size_t)len);
  for (local_d0 = 0; local_d0 < 0x40; local_d0 = local_d0 + 1) {
    local_48[local_d0] = local_48[local_d0] ^ 0x6a;
  }
  CSHA256::Write(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,(size_t)len);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CHMAC_SHA256::CHMAC_SHA256(const unsigned char* key, size_t keylen)
{
    unsigned char rkey[64];
    if (keylen <= 64) {
        memcpy(rkey, key, keylen);
        memset(rkey + keylen, 0, 64 - keylen);
    } else {
        CSHA256().Write(key, keylen).Finalize(rkey);
        memset(rkey + 32, 0, 32);
    }

    for (int n = 0; n < 64; n++)
        rkey[n] ^= 0x5c;
    outer.Write(rkey, 64);

    for (int n = 0; n < 64; n++)
        rkey[n] ^= 0x5c ^ 0x36;
    inner.Write(rkey, 64);
}